

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack17_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x1ffff;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x11;
  out[1] = uVar1 >> 0x11 | (uVar2 & 3) << 0xf;
  out[2] = uVar2 >> 2 & 0x1ffff;
  uVar1 = in[2];
  out[3] = uVar2 >> 0x13;
  out[3] = uVar2 >> 0x13 | (uVar1 & 0xf) << 0xd;
  uVar2 = in[3];
  out[4] = uVar1 >> 4 & 0x1ffff;
  out[5] = uVar1 >> 0x15;
  out[5] = uVar1 >> 0x15 | (uVar2 & 0x3f) << 0xb;
  out[6] = uVar2 >> 6 & 0x1ffff;
  out[7] = uVar2 >> 0x17;
  uVar1 = in[4];
  out[7] = uVar2 >> 0x17 | (uVar1 & 0xff) << 9;
  out[8] = uVar1 >> 8 & 0x1ffff;
  out[9] = uVar1 >> 0x19;
  uVar2 = in[5];
  out[9] = uVar1 >> 0x19 | (uVar2 & 0x3ff) << 7;
  out[10] = uVar2 >> 10 & 0x1ffff;
  out[0xb] = uVar2 >> 0x1b;
  uVar1 = in[6];
  out[0xb] = uVar2 >> 0x1b | (uVar1 & 0xfff) << 5;
  out[0xc] = uVar1 >> 0xc & 0x1ffff;
  uVar2 = in[7];
  out[0xd] = uVar1 >> 0x1d;
  out[0xd] = uVar1 >> 0x1d | (uVar2 & 0x3fff) << 3;
  out[0xe] = uVar2 >> 0xe & 0x1ffff;
  uVar1 = in[8];
  out[0xf] = uVar2 >> 0x1f;
  out[0xf] = (uVar1 & 0xffff) << 1 | uVar2 >> 0x1f;
  return in + 9;
}

Assistant:

const uint32_t *__fastunpack17_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 2)) << (17 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 17);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 4)) << (17 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 17);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 6)) << (17 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 17);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 8)) << (17 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 17);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 10)) << (17 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 17);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 12)) << (17 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 17);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 14)) << (17 - 14);
  out++;
  *out = ((*in) >> 14) % (1U << 17);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 16)) << (17 - 16);
  out++;

  return in + 1;
}